

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::EscapeForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,int flags)

{
  int iVar1;
  size_type sVar2;
  allocator_type *__a;
  string_view in;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  allocator_type local_fa;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> local_f9;
  string_view str_local;
  key_type local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8 [12];
  
  str_local._M_str = (char *)str._M_len;
  in._M_str._0_4_ = str._M_str._0_4_;
  str_local._M_len = (size_t)this;
  local_e8._M_len = (size_t)this;
  local_e8._M_str = str_local._M_str;
  if (cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)::
      shellOperators == '\0') {
    iVar1 = __cxa_guard_acquire(&cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                                 ::shellOperators);
    if (iVar1 != 0) {
      memcpy(local_d8,&DAT_009514f8,0xc0);
      __a = &local_fa;
      __l._M_len = 0xc;
      __l._M_array = local_d8;
      std::
      set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
               ::shellOperators,__l,&local_f9,__a);
      flags = (int)__a;
      __cxa_atexit(std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::~set,cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                          ::shellOperators,&__dso_handle);
      __cxa_guard_release(&cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                           ::shellOperators);
    }
  }
  sVar2 = std::
          set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::count((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                     ::shellOperators,&local_e8);
  if (sVar2 == 0) {
    in._M_len = (size_t)str_local._M_str;
    in._M_str._4_4_ = 0;
    Shell_GetArgument_abi_cxx11_
              (__return_storage_ptr__,(cmOutputConverter *)str_local._M_len,in,flags);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&str_local,(allocator<char> *)local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(cm::string_view str, int flags)
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return std::string(str);
  }

  return Shell_GetArgument(str, flags);
}